

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

uchar IDisk::ConvertMFMToByte(uchar *pattern)

{
  byte bVar1;
  int local_1c;
  int i;
  int dec;
  uchar b;
  uchar *pattern_local;
  
  i._3_1_ = 0;
  bVar1 = 7;
  for (local_1c = 1; local_1c < 0x10; local_1c = local_1c + 2) {
    i._3_1_ = i._3_1_ | (byte)((pattern[local_1c] & 1) << (bVar1 & 0x1f));
    bVar1 = bVar1 - 1;
  }
  return i._3_1_;
}

Assistant:

unsigned char IDisk::ConvertMFMToByte(const unsigned char pattern[16])
{
   unsigned char b = 0;
   auto dec = 7;
   for (auto i = 1; i < 16; i += 2)
   {
      if (i > 2 &&
         (
            (pattern[i - 1] == 1 && pattern[i - 2] == 1)
            || (pattern[i - 1] == 1 && pattern[i] == 1)
            || (pattern[i - 1] == 0 && pattern[i - 2] == 0 && pattern[i] == 0)
         )
      )
      {
      }
      b |= ((pattern[i] & 1) << dec);
      dec--;
   }
   return b;
}